

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

CURLcode Curl_auth_decode_digest_http_message(char *chlg,digestdata *digest)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  ushort **ppuVar6;
  char *pcVar7;
  bool bVar8;
  char *local_540;
  char *tok_buf;
  char content [1024];
  char value [256];
  char *tmp;
  char *token;
  _Bool foundAuthInt;
  _Bool foundAuth;
  _Bool before;
  digestdata *digest_local;
  char *chlg_local;
  
  bVar2 = false;
  bVar3 = false;
  pcVar1 = digest->nonce;
  digest_local = (digestdata *)chlg;
  Curl_auth_digest_cleanup(digest);
  while( true ) {
    while( true ) {
      bVar8 = false;
      if (*(char *)&digest_local->nonce != '\0') {
        ppuVar6 = __ctype_b_loc();
        bVar8 = ((*ppuVar6)[(int)(uint)*(byte *)&digest_local->nonce] & 0x2000) != 0;
      }
      if (!bVar8) break;
      digest_local = (digestdata *)((long)&digest_local->nonce + 1);
    }
    _Var4 = Curl_auth_digest_get_pair
                      ((char *)digest_local,content + 0x3f8,(char *)&tok_buf,(char **)&digest_local)
    ;
    if (!_Var4) break;
    iVar5 = Curl_strcasecompare(content + 0x3f8,"nonce");
    if (iVar5 == 0) {
      iVar5 = Curl_strcasecompare(content + 0x3f8,"stale");
      if (iVar5 == 0) {
        iVar5 = Curl_strcasecompare(content + 0x3f8,"realm");
        if (iVar5 == 0) {
          iVar5 = Curl_strcasecompare(content + 0x3f8,"opaque");
          if (iVar5 == 0) {
            iVar5 = Curl_strcasecompare(content + 0x3f8,"qop");
            if (iVar5 == 0) {
              iVar5 = Curl_strcasecompare(content + 0x3f8,"algorithm");
              if (iVar5 != 0) {
                (*Curl_cfree)(digest->algorithm);
                pcVar7 = (*Curl_cstrdup)((char *)&tok_buf);
                digest->algorithm = pcVar7;
                if (digest->algorithm == (char *)0x0) {
                  return CURLE_OUT_OF_MEMORY;
                }
                iVar5 = Curl_strcasecompare((char *)&tok_buf,"MD5-sess");
                if (iVar5 == 0) {
                  iVar5 = Curl_strcasecompare((char *)&tok_buf,"MD5");
                  if (iVar5 == 0) {
                    return CURLE_BAD_CONTENT_ENCODING;
                  }
                  digest->algo = 0;
                }
                else {
                  digest->algo = 1;
                }
              }
            }
            else {
              local_540 = (char *)0x0;
              pcVar7 = (*Curl_cstrdup)((char *)&tok_buf);
              if (pcVar7 == (char *)0x0) {
                return CURLE_OUT_OF_MEMORY;
              }
              tmp = strtok_r(pcVar7,",",&local_540);
              while (tmp != (char *)0x0) {
                iVar5 = Curl_strcasecompare(tmp,"auth");
                if (iVar5 == 0) {
                  iVar5 = Curl_strcasecompare(tmp,"auth-int");
                  if (iVar5 != 0) {
                    bVar3 = true;
                  }
                }
                else {
                  bVar2 = true;
                }
                tmp = strtok_r((char *)0x0,",",&local_540);
              }
              (*Curl_cfree)(pcVar7);
              if (bVar2) {
                (*Curl_cfree)(digest->qop);
                pcVar7 = (*Curl_cstrdup)("auth");
                digest->qop = pcVar7;
                if (digest->qop == (char *)0x0) {
                  return CURLE_OUT_OF_MEMORY;
                }
              }
              else if (bVar3) {
                (*Curl_cfree)(digest->qop);
                pcVar7 = (*Curl_cstrdup)("auth-int");
                digest->qop = pcVar7;
                if (digest->qop == (char *)0x0) {
                  return CURLE_OUT_OF_MEMORY;
                }
              }
            }
          }
          else {
            (*Curl_cfree)(digest->opaque);
            pcVar7 = (*Curl_cstrdup)((char *)&tok_buf);
            digest->opaque = pcVar7;
            if (digest->opaque == (char *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
          }
        }
        else {
          (*Curl_cfree)(digest->realm);
          pcVar7 = (*Curl_cstrdup)((char *)&tok_buf);
          digest->realm = pcVar7;
          if (digest->realm == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
      }
      else {
        iVar5 = Curl_strcasecompare((char *)&tok_buf,"true");
        if (iVar5 != 0) {
          digest->stale = true;
          digest->nc = 1;
        }
      }
    }
    else {
      (*Curl_cfree)(digest->nonce);
      pcVar7 = (*Curl_cstrdup)((char *)&tok_buf);
      digest->nonce = pcVar7;
      if (digest->nonce == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    while( true ) {
      bVar8 = false;
      if (*(char *)&digest_local->nonce != '\0') {
        ppuVar6 = __ctype_b_loc();
        bVar8 = ((*ppuVar6)[(int)(uint)*(byte *)&digest_local->nonce] & 0x2000) != 0;
      }
      if (!bVar8) break;
      digest_local = (digestdata *)((long)&digest_local->nonce + 1);
    }
    if (*(char *)&digest_local->nonce == ',') {
      digest_local = (digestdata *)((long)&digest_local->nonce + 1);
    }
  }
  if ((pcVar1 != (char *)0x0) && ((digest->stale & 1U) == 0)) {
    return CURLE_BAD_CONTENT_ENCODING;
  }
  if (digest->nonce == (char *)0x0) {
    return CURLE_BAD_CONTENT_ENCODING;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_auth_decode_digest_http_message(const char *chlg,
                                              struct digestdata *digest)
{
  bool before = FALSE; /* got a nonce before */
  bool foundAuth = FALSE;
  bool foundAuthInt = FALSE;
  char *token = NULL;
  char *tmp = NULL;

  /* If we already have received a nonce, keep that in mind */
  if(digest->nonce)
    before = TRUE;

  /* Clean up any former leftovers and initialise to defaults */
  Curl_auth_digest_cleanup(digest);

  for(;;) {
    char value[DIGEST_MAX_VALUE_LENGTH];
    char content[DIGEST_MAX_CONTENT_LENGTH];

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Extract a value=content pair */
    if(Curl_auth_digest_get_pair(chlg, value, content, &chlg)) {
      if(strcasecompare(value, "nonce")) {
        free(digest->nonce);
        digest->nonce = strdup(content);
        if(!digest->nonce)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "stale")) {
        if(strcasecompare(content, "true")) {
          digest->stale = TRUE;
          digest->nc = 1; /* we make a new nonce now */
        }
      }
      else if(strcasecompare(value, "realm")) {
        free(digest->realm);
        digest->realm = strdup(content);
        if(!digest->realm)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "opaque")) {
        free(digest->opaque);
        digest->opaque = strdup(content);
        if(!digest->opaque)
          return CURLE_OUT_OF_MEMORY;
      }
      else if(strcasecompare(value, "qop")) {
        char *tok_buf = NULL;
        /* Tokenize the list and choose auth if possible, use a temporary
           clone of the buffer since strtok_r() ruins it */
        tmp = strdup(content);
        if(!tmp)
          return CURLE_OUT_OF_MEMORY;

        token = strtok_r(tmp, ",", &tok_buf);
        while(token != NULL) {
          if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH)) {
            foundAuth = TRUE;
          }
          else if(strcasecompare(token, DIGEST_QOP_VALUE_STRING_AUTH_INT)) {
            foundAuthInt = TRUE;
          }
          token = strtok_r(NULL, ",", &tok_buf);
        }

        free(tmp);

        /* Select only auth or auth-int. Otherwise, ignore */
        if(foundAuth) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
        else if(foundAuthInt) {
          free(digest->qop);
          digest->qop = strdup(DIGEST_QOP_VALUE_STRING_AUTH_INT);
          if(!digest->qop)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else if(strcasecompare(value, "algorithm")) {
        free(digest->algorithm);
        digest->algorithm = strdup(content);
        if(!digest->algorithm)
          return CURLE_OUT_OF_MEMORY;

        if(strcasecompare(content, "MD5-sess"))
          digest->algo = CURLDIGESTALGO_MD5SESS;
        else if(strcasecompare(content, "MD5"))
          digest->algo = CURLDIGESTALGO_MD5;
        else
          return CURLE_BAD_CONTENT_ENCODING;
      }
      else {
        /* Unknown specifier, ignore it! */
      }
    }
    else
      break; /* We're done here */

    /* Pass all additional spaces here */
    while(*chlg && ISSPACE(*chlg))
      chlg++;

    /* Allow the list to be comma-separated */
    if(',' == *chlg)
      chlg++;
  }

  /* We had a nonce since before, and we got another one now without
     'stale=true'. This means we provided bad credentials in the previous
     request */
  if(before && !digest->stale)
    return CURLE_BAD_CONTENT_ENCODING;

  /* We got this header without a nonce, that's a bad Digest line! */
  if(!digest->nonce)
    return CURLE_BAD_CONTENT_ENCODING;

  return CURLE_OK;
}